

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.cc
# Opt level: O2

AttrValue * __thiscall
bloaty::dwarf::AttrValue::ParseAttr
          (AttrValue *__return_storage_ptr__,AttrValue *this,CU *cu,uint16_t form,string_view *data)

{
  byte bVar1;
  unsigned_short uVar2;
  uint uVar3;
  unsigned_long uVar4;
  undefined6 in_register_0000000a;
  string_view *data_00;
  ulong uVar5;
  string_view sVar6;
  string_view sVar7;
  string_view format;
  string local_78;
  Arg local_58;
  
  data_00 = (string_view *)CONCAT62(in_register_0000000a,form);
  uVar5 = (ulong)cu & 0xffffffff;
LAB_001a0bfa:
  uVar2 = (unsigned_short)uVar5;
  uVar3 = (uint)uVar5 & 0xffff;
  switch(uVar3) {
  case 1:
    goto switchD_001a0c0c_caseD_1;
  case 2:
  case 0x1c:
  case 0x1d:
  case 0x24:
switchD_001a0c0c_caseD_2:
    absl::substitute_internal::Arg::Arg(&local_58,uVar2);
    format._M_str = (char *)&local_58;
    format._M_len = (size_t)"Don\'t know how to parse DWARF form: $0";
    absl::Substitute_abi_cxx11_(&local_78,(absl *)0x26,format,(Arg *)data);
    Throw(local_78._M_dataplus._M_p,0xf0);
  case 3:
    sVar6 = ReadBlock<unsigned_short>(data_00);
    *(size_t *)&__return_storage_ptr__->field_0 = sVar6._M_len;
    *(char **)((long)&__return_storage_ptr__->field_0 + 8) = sVar6._M_str;
    __return_storage_ptr__->form_ = 3;
    break;
  case 4:
    sVar6 = ReadBlock<unsigned_int>(data_00);
    *(size_t *)&__return_storage_ptr__->field_0 = sVar6._M_len;
    *(char **)((long)&__return_storage_ptr__->field_0 + 8) = sVar6._M_str;
    __return_storage_ptr__->form_ = 4;
    break;
  case 5:
    sVar7 = ReadBytes(2,data_00);
    (__return_storage_ptr__->field_0).string_ = sVar7;
    __return_storage_ptr__->form_ = 5;
    break;
  case 6:
    sVar7 = ReadBytes(4,data_00);
    (__return_storage_ptr__->field_0).string_ = sVar7;
    __return_storage_ptr__->form_ = 6;
    break;
  case 7:
    sVar7 = ReadBytes(8,data_00);
    (__return_storage_ptr__->field_0).string_ = sVar7;
    __return_storage_ptr__->form_ = 7;
    break;
  case 8:
    sVar7 = ReadNullTerminated(data_00);
    (__return_storage_ptr__->field_0).string_ = sVar7;
    __return_storage_ptr__->form_ = 8;
    break;
  case 9:
  case 0x18:
    sVar6 = ReadVariableBlock(data_00);
    *(size_t *)&__return_storage_ptr__->field_0 = sVar6._M_len;
    *(char **)((long)&__return_storage_ptr__->field_0 + 8) = sVar6._M_str;
    __return_storage_ptr__->form_ = uVar2;
    break;
  case 10:
    sVar6 = ReadBlock<unsigned_char>(data_00);
    *(size_t *)&__return_storage_ptr__->field_0 = sVar6._M_len;
    *(char **)((long)&__return_storage_ptr__->field_0 + 8) = sVar6._M_str;
    __return_storage_ptr__->form_ = 10;
    break;
  case 0xb:
    sVar7 = ReadBytes(1,data_00);
    (__return_storage_ptr__->field_0).string_ = sVar7;
    __return_storage_ptr__->form_ = 0xb;
    break;
  case 0xc:
    bVar1 = ReadFixed<unsigned_char,1ul>(data_00);
    *(ulong *)&__return_storage_ptr__->field_0 = (ulong)bVar1;
    __return_storage_ptr__->form_ = 0xc;
    goto LAB_001a0f3d;
  case 0xd:
    uVar4 = ReadLEB128<unsigned_long>(data_00);
    (__return_storage_ptr__->field_0).uint_ = uVar4;
    __return_storage_ptr__->form_ = 0xd;
    goto LAB_001a0f3d;
  case 0xe:
    if (this[1].field_0x12 == '\x01') {
      sVar7 = ReadIndirectString<unsigned_long>((CU *)this,data_00);
    }
    else {
      sVar7 = ReadIndirectString<unsigned_int>((CU *)this,data_00);
    }
    (__return_storage_ptr__->field_0).string_ = sVar7;
    __return_storage_ptr__->form_ = 0xe;
    break;
  case 0xf:
    uVar4 = ReadLEB128<unsigned_long>(data_00);
    (__return_storage_ptr__->field_0).uint_ = uVar4;
    __return_storage_ptr__->form_ = 0xf;
    goto LAB_001a0f3d;
  case 0x10:
    if (2 < (byte)this[1].form_) goto switchD_001a0c0c_caseD_17;
    goto switchD_001a0c0c_caseD_1;
  case 0x11:
    bVar1 = ReadFixed<unsigned_char,1ul>(data_00);
    *(ulong *)&__return_storage_ptr__->field_0 = (ulong)bVar1;
    __return_storage_ptr__->form_ = 0x11;
    goto LAB_001a0f3d;
  case 0x12:
    uVar2 = ReadFixed<unsigned_short,2ul>(data_00);
    *(ulong *)&__return_storage_ptr__->field_0 = (ulong)uVar2;
    __return_storage_ptr__->form_ = 0x12;
    goto LAB_001a0f3d;
  case 0x13:
    uVar3 = ReadFixed<unsigned_int,4ul>(data_00);
    *(ulong *)&__return_storage_ptr__->field_0 = (ulong)uVar3;
    __return_storage_ptr__->form_ = 0x13;
    goto LAB_001a0f3d;
  case 0x14:
  case 0x20:
    goto switchD_001a0c0c_caseD_14;
  case 0x15:
  case 0x25:
    bVar1 = ReadFixed<unsigned_char,1ul>(data_00);
    uVar4 = (unsigned_long)bVar1;
    goto LAB_001a0c58;
  case 0x16:
    goto switchD_001a0c0c_caseD_16;
  case 0x17:
switchD_001a0c0c_caseD_17:
    if (this[1].field_0x12 == '\x01') goto switchD_001a0c0c_caseD_14;
    goto LAB_001a0f2c;
  case 0x19:
    (__return_storage_ptr__->field_0).uint_ = 1;
    __return_storage_ptr__->form_ = 0x19;
    goto LAB_001a0f3d;
  case 0x1a:
    goto switchD_001a0c0c_caseD_1a;
  case 0x1b:
switchD_001a0c0c_caseD_1b:
    uVar4 = ReadLEB128<unsigned_long>(data_00);
    (__return_storage_ptr__->field_0).uint_ = uVar4;
    __return_storage_ptr__->form_ = uVar2;
    goto LAB_001a0ed7;
  case 0x1e:
    sVar7 = ReadBytes(0x10,data_00);
    (__return_storage_ptr__->field_0).string_ = sVar7;
    __return_storage_ptr__->form_ = 0x1e;
    break;
  case 0x1f:
    if (this[1].field_0x12 == '\x01') {
      sVar7 = ReadIndirectLineString<unsigned_long>((CU *)this,data_00);
    }
    else {
      sVar7 = ReadIndirectLineString<unsigned_int>((CU *)this,data_00);
    }
    (__return_storage_ptr__->field_0).string_ = sVar7;
    __return_storage_ptr__->form_ = 0x1f;
    break;
  case 0x21:
    (__return_storage_ptr__->field_0).uint_ = 1;
    __return_storage_ptr__->form_ = 0x21;
LAB_001a0f3d:
    __return_storage_ptr__->type_ = kUint;
    return __return_storage_ptr__;
  case 0x22:
  case 0x23:
    uVar4 = ReadLEB128<unsigned_long>(data_00);
    goto LAB_001a0f36;
  case 0x26:
    uVar2 = ReadFixed<unsigned_short,2ul>(data_00);
    *(ulong *)&__return_storage_ptr__->field_0 = (ulong)uVar2;
    __return_storage_ptr__->form_ = 0x26;
    goto LAB_001a0f56;
  case 0x27:
    uVar3 = ReadFixed<unsigned_int,3ul>(data_00);
    *(ulong *)&__return_storage_ptr__->field_0 = (ulong)uVar3;
    __return_storage_ptr__->form_ = 0x27;
    goto LAB_001a0f56;
  case 0x28:
    uVar3 = ReadFixed<unsigned_int,4ul>(data_00);
    *(ulong *)&__return_storage_ptr__->field_0 = (ulong)uVar3;
    __return_storage_ptr__->form_ = 0x28;
    goto LAB_001a0f56;
  case 0x29:
    bVar1 = ReadFixed<unsigned_char,1ul>(data_00);
    *(ulong *)&__return_storage_ptr__->field_0 = (ulong)bVar1;
    __return_storage_ptr__->form_ = 0x29;
    goto LAB_001a0ed7;
  case 0x2a:
    uVar2 = ReadFixed<unsigned_short,2ul>(data_00);
    *(ulong *)&__return_storage_ptr__->field_0 = (ulong)uVar2;
    __return_storage_ptr__->form_ = 0x2a;
    goto LAB_001a0ed7;
  case 0x2b:
    uVar3 = ReadFixed<unsigned_int,3ul>(data_00);
    *(ulong *)&__return_storage_ptr__->field_0 = (ulong)uVar3;
    __return_storage_ptr__->form_ = 0x2b;
    goto LAB_001a0ed7;
  case 0x2c:
    uVar3 = ReadFixed<unsigned_int,4ul>(data_00);
    *(ulong *)&__return_storage_ptr__->field_0 = (ulong)uVar3;
    __return_storage_ptr__->form_ = 0x2c;
LAB_001a0ed7:
    __return_storage_ptr__->type_ = kUnresolvedUint;
    return __return_storage_ptr__;
  default:
    if (uVar3 == 0x1f01) goto switchD_001a0c0c_caseD_1b;
    if (uVar3 != 0x1f02) goto switchD_001a0c0c_caseD_2;
    goto switchD_001a0c0c_caseD_1a;
  }
  __return_storage_ptr__->type_ = kString;
  return __return_storage_ptr__;
switchD_001a0c0c_caseD_16:
  uVar2 = ReadLEB128<unsigned_short>(data_00);
  uVar5 = (ulong)uVar2;
  if (uVar2 == 0x16) {
    Throw("indirect attribute has indirect form type",0x85);
  }
  goto LAB_001a0bfa;
switchD_001a0c0c_caseD_1:
  if (this[1].field_0x13 == '\0') {
LAB_001a0f2c:
    uVar3 = ReadFixed<unsigned_int,4ul>(data_00);
    uVar4 = (unsigned_long)uVar3;
  }
  else {
switchD_001a0c0c_caseD_14:
    uVar4 = ReadFixed<unsigned_long,8ul>(data_00);
  }
LAB_001a0f36:
  (__return_storage_ptr__->field_0).uint_ = uVar4;
  __return_storage_ptr__->form_ = uVar2;
  goto LAB_001a0f3d;
switchD_001a0c0c_caseD_1a:
  uVar4 = ReadLEB128<unsigned_long>(data_00);
LAB_001a0c58:
  (__return_storage_ptr__->field_0).uint_ = uVar4;
  __return_storage_ptr__->form_ = uVar2;
LAB_001a0f56:
  __return_storage_ptr__->type_ = kUnresolvedString;
  return __return_storage_ptr__;
}

Assistant:

AttrValue AttrValue::ParseAttr(const CU& cu, uint16_t form, string_view* data) {
  switch (form) {
    case DW_FORM_indirect: {
      uint16_t indirect_form = ReadLEB128<uint16_t>(data);
      if (indirect_form == DW_FORM_indirect) {
        THROW("indirect attribute has indirect form type");
      }
      return ParseAttr(cu, indirect_form, data);
    }
    case DW_FORM_ref1:
      return AttrValue(form, ReadFixed<uint8_t>(data));
    case DW_FORM_ref2:
      return AttrValue(form, ReadFixed<uint16_t>(data));
    case DW_FORM_ref4:
      return AttrValue(form, ReadFixed<uint32_t>(data));
    case DW_FORM_ref_sig8:
    case DW_FORM_ref8:
      return AttrValue(form, ReadFixed<uint64_t>(data));
    case DW_FORM_ref_udata:
    case DW_FORM_strx1:
      return AttrValue::UnresolvedString(form, ReadFixed<uint8_t>(data));
    case DW_FORM_strx2:
      return AttrValue::UnresolvedString(form, ReadFixed<uint16_t>(data));
    case DW_FORM_strx3:
      return AttrValue::UnresolvedString(form, ReadFixed<uint32_t, 3>(data));
    case DW_FORM_strx4:
      return AttrValue::UnresolvedString(form, ReadFixed<uint32_t>(data));
    case DW_FORM_strx:
    case DW_FORM_GNU_str_index:
      return AttrValue::UnresolvedString(form, ReadLEB128<uint64_t>(data));
    case DW_FORM_addrx1:
      return AttrValue::UnresolvedUint(form, ReadFixed<uint8_t>(data));
    case DW_FORM_addrx2:
      return AttrValue::UnresolvedUint(form, ReadFixed<uint16_t>(data));
    case DW_FORM_addrx3:
      return AttrValue::UnresolvedUint(form, ReadFixed<uint32_t, 3>(data));
    case DW_FORM_addrx4:
      return AttrValue::UnresolvedUint(form, ReadFixed<uint32_t>(data));
    case DW_FORM_addrx:
    case DW_FORM_GNU_addr_index:
      return AttrValue::UnresolvedUint(form, ReadLEB128<uint64_t>(data));
    case DW_FORM_addr:
    address_size:
      switch (cu.unit_sizes().address_size()) {
        case 4:
          return AttrValue(form, ReadFixed<uint32_t>(data));
        case 8:
          return AttrValue(form, ReadFixed<uint64_t>(data));
        default:
          BLOATY_UNREACHABLE();
      }
    case DW_FORM_ref_addr:
      if (cu.unit_sizes().dwarf_version() <= 2) {
        goto address_size;
      }
      ABSL_FALLTHROUGH_INTENDED;
    case DW_FORM_sec_offset:
      if (cu.unit_sizes().dwarf64()) {
        return AttrValue(form, ReadFixed<uint64_t>(data));
      } else {
        return AttrValue(form, ReadFixed<uint32_t>(data));
      }
    case DW_FORM_udata:
      return AttrValue(form, ReadLEB128<uint64_t>(data));
    case DW_FORM_block1:
      return AttrValue(form, ReadBlock<uint8_t>(data));
    case DW_FORM_block2:
      return AttrValue(form, ReadBlock<uint16_t>(data));
    case DW_FORM_block4:
      return AttrValue(form, ReadBlock<uint32_t>(data));
    case DW_FORM_block:
    case DW_FORM_exprloc:
      return AttrValue(form, ReadVariableBlock(data));
    case DW_FORM_string:
      return AttrValue(form, ReadNullTerminated(data));
    case DW_FORM_strp:
      if (cu.unit_sizes().dwarf64()) {
        return AttrValue(form, ReadIndirectString<uint64_t>(cu, data));
      } else {
        return AttrValue(form, ReadIndirectString<uint32_t>(cu, data));
      }
    case DW_FORM_line_strp:
      if (cu.unit_sizes().dwarf64()) {
        return AttrValue(form, ReadIndirectLineString<uint64_t>(cu, data));
      } else {
        return AttrValue(form, ReadIndirectLineString<uint32_t>(cu, data));
      }
    case DW_FORM_data1:
      return AttrValue(form, ReadBytes(1, data));
    case DW_FORM_data2:
      return AttrValue(form, ReadBytes(2, data));
    case DW_FORM_data4:
      return AttrValue(form, ReadBytes(4, data));
    case DW_FORM_data8:
      return AttrValue(form, ReadBytes(8, data));
    case DW_FORM_data16:
      return AttrValue(form, ReadBytes(16, data));
    case DW_FORM_loclistx:
    case DW_FORM_rnglistx:
      return AttrValue(form, ReadLEB128<uint64_t>(data));

    // Bloaty doesn't currently care about any bool or signed data.
    // So we fudge it a bit and just stuff these in a uint64.
    case DW_FORM_flag_present:
      return AttrValue(form, 1);
    case DW_FORM_flag:
      return AttrValue(form, ReadFixed<uint8_t>(data));
    case DW_FORM_sdata:
      return AttrValue(form, ReadLEB128<uint64_t>(data));
    case DW_FORM_implicit_const:
      return AttrValue(form, 1);
    default:
      THROWF("Don't know how to parse DWARF form: $0", form);
  }
}